

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_plats.cpp
# Opt level: O1

void __thiscall DPlat::PlayPlatSound(DPlat *this,char *sound)

{
  sector_t_conflict *sec;
  FName local_4;
  
  sec = (this->super_DMovingFloor).super_DMover.super_DSectorEffect.m_Sector;
  if ((sec->Flags & 0x40) == 0) {
    if (-1 < sec->seqType) {
      SN_StartSequence((sector_t *)sec,1,(int)sec->seqType,SEQ_PLATFORM,0,false);
      return;
    }
    if ((sec->SeqName).super_FName.Index == 0) {
      SN_StartSequence((sector_t *)sec,1,sound,0);
      return;
    }
    SN_StartSequence((sector_t *)sec,1,&local_4,0);
  }
  return;
}

Assistant:

void DPlat::PlayPlatSound (const char *sound)
{
	if (m_Sector->Flags & SECF_SILENTMOVE) return;

	if (m_Sector->seqType >= 0)
	{
		SN_StartSequence (m_Sector, CHAN_FLOOR, m_Sector->seqType, SEQ_PLATFORM, 0);
	}
	else if (m_Sector->SeqName != NAME_None)
	{
		SN_StartSequence (m_Sector, CHAN_FLOOR, m_Sector->SeqName, 0);
	}
	else
	{
		SN_StartSequence (m_Sector, CHAN_FLOOR, sound, 0);
	}
}